

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  string *psVar3;
  pointer pcVar4;
  void *pvVar5;
  pointer end;
  char cVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  ostream *poVar8;
  undefined8 uVar9;
  runtime_error *prVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  undefined1 auVar14 [12];
  Error e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
  command;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  htmlpath;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>_>_>
  map;
  Flag version;
  ArgumentParser parser;
  HelpFlag help;
  undefined1 local_a68 [8];
  _Alloc_hider local_a60;
  undefined *local_a58;
  char local_a50 [16];
  char **local_a40;
  undefined1 local_a38 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  undefined1 local_9c0 [8];
  _Alloc_hider local_9b8;
  undefined1 local_9b0 [32];
  _Alloc_hider local_990;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_988 [2];
  _Any_data local_8e8;
  _Manager_type local_8d8;
  _Invoker_type local_8d0;
  undefined1 local_8a0 [272];
  _Alloc_hider local_790;
  size_type local_788;
  _Hashtable<_8c854410_> local_748;
  FlagBase local_710;
  undefined1 local_600 [48];
  code *local_5d0;
  code *pcStack_5c8;
  Base **local_5c0 [2];
  Base *local_5b0 [2];
  code *local_5a0;
  _Alloc_hider _Stack_598;
  code *local_590 [2];
  undefined1 local_580 [104];
  string local_518 [144];
  _Alloc_hider local_488;
  char local_478 [16];
  _Alloc_hider local_468;
  char local_458 [16];
  _Alloc_hider local_448;
  char local_438 [16];
  _Alloc_hider local_428;
  char local_418 [40];
  undefined1 local_3f0 [688];
  FlagBase local_140;
  
  local_600._0_8_ = local_600 + 0x10;
  local_a40 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"init","");
  local_600._40_8_ = 0;
  local_600._32_8_ = Init;
  pcStack_5c8 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
                ::_M_invoke;
  local_5d0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
              ::_M_manager;
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"add","");
  _Stack_598._M_p = (pointer)0x0;
  local_5a0 = Add;
  local_590[1] = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
                 ::_M_invoke;
  local_590[0] = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
                 ::_M_manager;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_748,local_600,local_580,0,local_8a0,local_9c0,&local_140);
  lVar13 = 0;
  do {
    if (*(code **)((long)local_590 + lVar13) != (code *)0x0) {
      (**(code **)((long)local_590 + lVar13))((long)&local_5a0 + lVar13,(long)&local_5a0 + lVar13,3)
      ;
    }
    if ((void *)((long)local_5b0 + lVar13) != *(void **)((long)local_5c0 + lVar13)) {
      operator_delete(*(void **)((long)local_5c0 + lVar13));
    }
    lVar13 = lVar13 + -0x40;
  } while (lVar13 != -0x80);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_9f8,
             local_a40 + 1,local_a40 + argc,(allocator_type *)local_600);
  pcVar2 = local_8a0 + 0x10;
  local_8a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a0,"This is a git-like program","");
  local_9c0 = (undefined1  [8])local_9b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c0,"Valid commands are init and add","");
  ::args::ArgumentParser::ArgumentParser
            ((ArgumentParser *)local_600,(string *)local_8a0,(string *)local_9c0);
  if (local_9c0 != (undefined1  [8])local_9b0) {
    operator_delete((void *)local_9c0);
  }
  if ((pointer)local_8a0._0_8_ != pcVar2) {
    operator_delete((void *)local_8a0._0_8_);
  }
  psVar3 = &local_710.super_NamedBase.super_Base.help;
  local_710.super_NamedBase.super_Base._vptr_Base = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"help","");
  local_a68 = (undefined1  [8])&local_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"Display this help menu","");
  pcVar4 = local_9b0 + 8;
  local_9c0._0_2_ = 0x6801;
  local_9b0._0_8_ = 0;
  local_9b0[8] = '\0';
  local_9b0._24_2_ = 0;
  local_990._M_p = (pointer)&local_988[0]._M_bucket_count;
  local_9b8._M_p = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_9c0;
  ::args::Matcher::Matcher((Matcher *)local_8a0,in);
  ::args::Flag::Flag((Flag *)&local_140,(Group *)local_600,(string *)&local_710,(string *)local_a68,
                     (Matcher *)local_8a0,None);
  local_140.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_00122520;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_8a0 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_8a0);
  lVar13 = 0;
  do {
    pvVar5 = *(void **)((long)local_988 + lVar13 + -8);
    if ((void *)((long)&local_988[0]._M_bucket_count + lVar13) != pvVar5) {
      operator_delete(pvVar5);
    }
    lVar13 = lVar13 + -0x28;
  } while (lVar13 != -0x50);
  if (local_a68 != (undefined1  [8])&local_a58) {
    operator_delete((void *)local_a68);
  }
  if ((string *)local_710.super_NamedBase.super_Base._vptr_Base != psVar3) {
    operator_delete(local_710.super_NamedBase.super_Base._vptr_Base);
  }
  std::__cxx11::string::string((string *)local_8a0,*local_a40,(allocator *)local_9c0);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0xa8));
  if ((pointer)local_8a0._0_8_ != pcVar2) {
    operator_delete((void *)local_8a0._0_8_);
  }
  local_8a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"{command options}","");
  std::__cxx11::string::_M_assign(local_518);
  if ((pointer)local_8a0._0_8_ != pcVar2) {
    operator_delete((void *)local_8a0._0_8_);
  }
  local_a68 = (undefined1  [8])&local_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"version","");
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a38 + 0x10);
  local_a38._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"Show the version of this program","");
  local_9c0 = (undefined1  [8])((ulong)local_9c0 & 0xffffffffffff0000);
  local_9b8._M_p = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"version","");
  in_00._M_len = 1;
  in_00._M_array = (iterator)local_9c0;
  ::args::Matcher::Matcher((Matcher *)local_8a0,in_00);
  ::args::Flag::Flag((Flag *)&local_710,(Group *)local_600,(string *)local_a68,(string *)local_a38,
                     (Matcher *)local_8a0,None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_8a0 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_8a0);
  if (local_9b8._M_p != pcVar4) {
    operator_delete(local_9b8._M_p);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_a38._0_8_);
  }
  if (local_a68 != (undefined1  [8])&local_a58) {
    operator_delete((void *)local_a68);
  }
  local_a38._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"html-path","");
  local_a18._M_allocated_capacity = (size_type)&local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"Specify the html path","");
  local_a68 = (undefined1  [8])((ulong)local_a68 & 0xffffffffffff0000);
  local_a60._M_p = local_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"html-path","");
  in_01._M_len = 1;
  in_01._M_array = (iterator)local_a68;
  ::args::Matcher::Matcher((Matcher *)local_9c0,in_01);
  local_9e0._M_string_length = 0;
  local_9e0.field_2._M_local_buf[0] = '\0';
  local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
  ::args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_8a0,(Group *)local_600,(string *)local_a38,(string *)&local_a18,
              (Matcher *)local_9c0,&local_9e0,None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_988);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_9c0);
  if (local_a60._M_p != local_a50) {
    operator_delete(local_a60._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_allocated_capacity != &local_a08) {
    operator_delete((void *)local_a18._M_allocated_capacity);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_a38._0_8_);
  }
  local_a68 = (undefined1  [8])&local_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"command","");
  local_a38._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"Command to execute","");
  local_a08._M_allocated_capacity = 0;
  local_a08._8_8_ = 0;
  local_a18._M_allocated_capacity = 0;
  local_a18._8_8_ = 0;
  ::args::
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
  ::MapPositional((MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
                   *)local_9c0,(Group *)local_600,(string *)local_a68,(string *)local_a38,
                  (unordered_map<std::__cxx11::basic_string<char>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char>_*,_std::vector<std::__cxx11::basic_string<char>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char>_*,_std::vector<std::__cxx11::basic_string<char>_>_>)>_>
                   *)&local_748,
                  (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
                   *)&local_a18,None);
  if ((code *)local_a08._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_a08._M_allocated_capacity)(&local_a18,&local_a18,3);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_a38._0_8_);
  }
  if (local_a68 != (undefined1  [8])&local_a58) {
    operator_delete((void *)local_a68);
  }
  end = local_9f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  local_9b8._M_p = local_9b8._M_p | 0x20;
  (**(_func_int **)(local_600._0_8_ + 0x70))((ArgumentParser *)local_600);
  _Var7 = ::args::ArgumentParser::
          Parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((ArgumentParser *)local_600,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_9f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )end);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Before command options:",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Version called: ",0x10);
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_710.super_NamedBase.super_Base._vptr_Base + 0x10))->
            _M_allocated_capacity)();
  poVar8 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"html-path called: ",0x12);
  (**(code **)(local_8a0._0_8_ + 0x10))();
  poVar8 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", value: ",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_790._M_p,local_788);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  cVar6 = (**(code **)((long)local_9c0 + 0x10))();
  if (cVar6 == '\0') {
    iVar12 = 0;
    ::args::ArgumentParser::Help((ArgumentParser *)local_600,(ostream *)&std::cout);
  }
  else {
    std::__cxx11::string::string((string *)local_a68,*local_a40,(allocator *)&local_9e0);
    local_a18._M_allocated_capacity =
         (size_type)
         local_9f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_a38._0_8_ = _Var7;
    if (local_8d8 == (_Manager_type)0x0) {
      auVar14 = std::__throw_bad_function_call();
      uVar9 = auVar14._0_8_;
      if (auVar14._8_4_ != 3) {
        if (auVar14._8_4_ != 2) {
          ::args::
          MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
          ::~MapPositional((MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
                            *)local_9c0);
          ::args::
          ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
          ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                        *)local_8a0);
          ::args::FlagBase::~FlagBase(&local_710);
          ::args::FlagBase::~FlagBase(&local_140);
          ::args::ArgumentParser::~ArgumentParser((ArgumentParser *)local_600);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_9f8);
          std::_Hashtable<$8c854410$>::~_Hashtable(&local_748);
          _Unwind_Resume(uVar9);
        }
        prVar10 = (runtime_error *)__cxa_get_exception_ptr(uVar9);
        std::runtime_error::runtime_error((runtime_error *)local_a68,prVar10);
        local_a68 = (undefined1  [8])&PTR__runtime_error_00122400;
        __cxa_begin_catch(uVar9);
        pcVar11 = (char *)std::runtime_error::what();
        poVar8 = std::operator<<((ostream *)&std::cerr,pcVar11);
        std::endl<char,std::char_traits<char>>(poVar8);
        ::args::ArgumentParser::Help((ArgumentParser *)local_600,(ostream *)&std::cerr);
        std::runtime_error::~runtime_error((runtime_error *)local_a68);
        __cxa_end_catch();
        iVar12 = 1;
        goto LAB_00105e9e;
      }
      prVar10 = (runtime_error *)__cxa_get_exception_ptr(uVar9);
      std::runtime_error::runtime_error((runtime_error *)local_a68,prVar10);
      local_a68 = (undefined1  [8])&PTR__runtime_error_001228f8;
      __cxa_begin_catch(uVar9);
      ::args::ArgumentParser::Help((ArgumentParser *)local_600,(ostream *)&std::cout);
      std::runtime_error::~runtime_error((runtime_error *)local_a68);
      __cxa_end_catch();
    }
    else {
      (*local_8d0)(&local_8e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a68,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_a38,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_a18._M_allocated_capacity);
      if (local_a68 != (undefined1  [8])&local_a58) {
        operator_delete((void *)local_a68);
      }
    }
    iVar12 = 0;
  }
LAB_00105e9e:
  ::args::
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
  ::~MapPositional((MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
                    *)local_9c0);
  ::args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_8a0);
  ::args::FlagBase::~FlagBase(&local_710);
  ::args::FlagBase::~FlagBase(&local_140);
  local_600._0_8_ = &PTR__ArgumentParser_00122118;
  ::args::HelpParams::~HelpParams((HelpParams *)local_3f0);
  if (local_428._M_p != local_418) {
    operator_delete(local_428._M_p);
  }
  if (local_448._M_p != local_438) {
    operator_delete(local_448._M_p);
  }
  if (local_468._M_p != local_458) {
    operator_delete(local_468._M_p);
  }
  if (local_488._M_p != local_478) {
    operator_delete(local_488._M_p);
  }
  ::args::Command::~Command((Command *)local_600);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9f8);
  std::_Hashtable<$8c854410$>::~_Hashtable(&local_748);
  return iVar12;
}

Assistant:

int main(int argc, char **argv)
{
    std::unordered_map<std::string, commandtype> map{
        {"init", Init},
        {"add", Add}};

    const std::vector<std::string> args(argv + 1, argv + argc);
    args::ArgumentParser parser("This is a git-like program", "Valid commands are init and add");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    parser.Prog(argv[0]);
    parser.ProglinePostfix("{command options}");
    args::Flag version(parser, "version", "Show the version of this program", {"version"});
    args::ValueFlag<std::string> htmlpath(parser, "html-path", "Specify the html path", {"html-path"});
    args::MapPositional<std::string, commandtype> command(parser, "command", "Command to execute", map);
    command.KickOut(true);
    try
    {
        auto next = parser.ParseArgs(args);
        std::cout << std::boolalpha;
        std::cout << "Before command options:" << std::endl;
        std::cout << "Version called: " << bool{version} << std::endl;
        std::cout << "html-path called: " << bool{htmlpath} << ", value: " << args::get(htmlpath) << std::endl;
        if (command)
        {
            args::get(command)(argv[0], next, std::end(args));
        } else
        {
            std::cout << parser;
        }
    }
    catch (args::Help)
    {
        std::cout << parser;
        return 0;
    }
    catch (args::Error e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return 1;
    }
    return 0;
}